

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O2

void __thiscall nesvis::MemoryWidget::MemoryWidget(MemoryWidget *this,Nes *nes)

{
  long lVar1;
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_1be;
  allocator_type local_1bd;
  int local_1bc [9];
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  this->nes_ = nes;
  (this->goto_address_input_)._M_dataplus._M_p = (pointer)&(this->goto_address_input_).field_2;
  (this->goto_address_input_)._M_string_length = 0;
  (this->goto_address_input_).field_2._M_local_buf[0] = '\0';
  (this->goto_address_).super__Optional_base<unsigned_short,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_short>._M_engaged = false;
  local_1bc[8] = 0;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[4],_true>(&local_198,local_1bc + 8,(char (*) [4])"Ram");
  local_1bc[7] = 0x800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_170,local_1bc + 7,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_1bc[6] = 0x1000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_148,local_1bc + 6,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_1bc[5] = 0x1800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_120,local_1bc + 5,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_1bc[4] = 0x2000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>(&local_f8,local_1bc + 4,(char (*) [14])"PPU Registers");
  local_1bc[3] = 0x2008;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_d0,local_1bc + 3,(char (*) [24])"Mirror of 0x2000-0x2007");
  local_1bc[2] = 0x4000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[21],_true>
            (&local_a8,local_1bc + 2,(char (*) [21])"Apu and I/O register");
  local_1bc[1] = 0x4020;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>(&local_80,local_1bc + 1,(char (*) [16])"Cartridge space");
  __l._M_len = 8;
  __l._M_array = &local_198;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->cpu_mem_labels_,__l,(less<unsigned_short> *)local_1bc,&local_1be);
  lVar1 = 0x120;
  do {
    std::__cxx11::string::~string((string *)((long)&local_198.first + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  local_1bc[8] = 0;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>(&local_198,local_1bc + 8,(char (*) [16])"Pattern table 0");
  local_1bc[7] = 0x1000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>(&local_170,local_1bc + 7,(char (*) [16])"Pattern table 1");
  local_1bc[6] = 0x2000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_148,local_1bc + 6,(char (*) [12])"Nametable 0");
  local_1bc[5] = 0x2400;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_120,local_1bc + 5,(char (*) [12])"Nametable 1");
  local_1bc[4] = 0x2800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_f8,local_1bc + 4,(char (*) [12])"Nametable 2");
  local_1bc[3] = 0x2c00;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_d0,local_1bc + 3,(char (*) [12])"Nametable 3");
  local_1bc[2] = 0x3000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_a8,local_1bc + 2,(char (*) [24])"Mirror of 0x2000-0x2EFF");
  local_1bc[1] = 0x3f00;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>(&local_80,local_1bc + 1,(char (*) [8])"Palette");
  local_1bc[0] = 0x3f20;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (&local_58,local_1bc,(char (*) [24])"Mirror of 0x3F00-0x3F1F");
  __l_00._M_len = 9;
  __l_00._M_array = &local_198;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ppu_mem_lables_,__l_00,(less<unsigned_short> *)&local_1be,&local_1bd);
  lVar1 = 0x148;
  do {
    std::__cxx11::string::~string((string *)((long)&local_198.first + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

explicit MemoryWidget(n_e_s::nes::Nes *nes) : nes_(nes) {}